

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedBrs.cpp
# Opt level: O0

void __thiscall
wasm::RemoveUnusedBrs::doWalkFunction(wasm::Function*)::FinalOptimizer::restructureIf(wasm::Block__
          (void *this,Block *curr)

{
  PassOptions *pPVar1;
  Type TVar2;
  bool bVar3;
  Index IVar4;
  ExpressionList *this_00;
  size_t sVar5;
  Expression **ppEVar6;
  Module *pMVar7;
  Unary *condition;
  If *pIVar8;
  Select *expression;
  Name target;
  bool local_371;
  EffectAnalyzer local_368;
  byte local_1f2;
  byte local_1f1;
  undefined1 local_1f0 [6];
  bool hasSideEffects;
  bool canReorder;
  Nop nop;
  Expression *old;
  EffectAnalyzer local_1c8;
  uintptr_t local_58;
  Expression *local_50;
  char *local_48;
  BasicType local_3c;
  Builder local_38;
  Builder builder;
  Drop *drop;
  Break *br;
  ExpressionList *list;
  Block *curr_local;
  FinalOptimizer *this_local;
  
  this_00 = &curr->list;
  sVar5 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                    (&this_00->
                      super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
  if (sVar5 < 2) {
    __assert_fail("list.size() >= 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/RemoveUnusedBrs.cpp"
                  ,0x413,
                  "void wasm::RemoveUnusedBrs::doWalkFunction(Function *)::FinalOptimizer::restructureIf(Block *)"
                 );
  }
  bVar3 = IString::is(&(curr->name).super_IString);
  if (bVar3) {
    ppEVar6 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                        (&this_00->
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                         ,0);
    builder.wasm = (Module *)Expression::dynCast<wasm::Drop>(*ppEVar6);
    if (builder.wasm == (Module *)0x0) {
      ppEVar6 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&this_00->
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,0);
      drop = (Drop *)Expression::dynCast<wasm::Break>(*ppEVar6);
    }
    else {
      drop = (Drop *)Expression::dynCast<wasm::Break>
                               ((Expression *)
                                ((builder.wasm)->exports).
                                super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    pMVar7 = Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::getModule
                       ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)this);
    Builder::Builder(&local_38,pMVar7);
    local_371 = false;
    if ((drop != (Drop *)0x0) && (local_371 = false, drop[1].value != (Expression *)0x0)) {
      bVar3 = IString::operator==((IString *)&drop->value,&(curr->name).super_IString);
      local_371 = false;
      if (bVar3) {
        local_3c = unreachable;
        local_371 = wasm::Type::operator!=
                              (&(drop->super_SpecificExpression<(wasm::Expression::Id)18>).
                                super_Expression.type,&local_3c);
      }
    }
    if (local_371 != false) {
      local_50 = (Expression *)(curr->name).super_IString.str._M_len;
      local_48 = (curr->name).super_IString.str._M_str;
      target.super_IString.str._M_str = (char *)local_50;
      target.super_IString.str._M_len = (size_t)local_48;
      IVar4 = BranchUtils::BranchSeeker::count((BranchSeeker *)curr,local_50,target);
      if (IVar4 == 1) {
        if (builder.wasm == (Module *)0x0) {
          if (drop[1].super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression.type.id !=
              0) {
            __assert_fail("!br->value",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/RemoveUnusedBrs.cpp"
                          ,0x426,
                          "void wasm::RemoveUnusedBrs::doWalkFunction(Function *)::FinalOptimizer::restructureIf(Block *)"
                         );
          }
          condition = Builder::makeUnary(&local_38,EqZInt32,drop[1].value);
          pIVar8 = Builder::makeIf(&local_38,(Expression *)condition,(Expression *)curr,
                                   (Expression *)0x0);
          Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::replaceCurrent
                    ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)this,
                     (Expression *)pIVar8);
          ExpressionManipulator::nop<wasm::Break>((Break *)drop);
          local_58 = (curr->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type
                     .id;
          Block::finalize(curr,(Type)local_58);
        }
        else {
          pPVar1 = *(PassOptions **)((long)this + 0xe0);
          pMVar7 = Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::getModule
                             ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)this);
          EffectAnalyzer::EffectAnalyzer
                    (&local_1c8,pPVar1,pMVar7,
                     (Expression *)
                     drop[1].super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression.
                     type.id);
          bVar3 = EffectAnalyzer::hasSideEffects(&local_1c8);
          EffectAnalyzer::~EffectAnalyzer(&local_1c8);
          if (((bVar3 ^ 0xffU) & 1) == 0) {
            ppEVar6 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                      operator[](&this_00->
                                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                 ,0);
            nop.super_SpecificExpression<(wasm::Expression::Id)22>.super_Expression.type.id =
                 (uintptr_t)*ppEVar6;
            Nop::Nop((Nop *)local_1f0);
            ppEVar6 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                      operator[](&this_00->
                                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                 ,0);
            *ppEVar6 = (Expression *)local_1f0;
            pPVar1 = *(PassOptions **)((long)this + 0xe0);
            pMVar7 = Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::getModule
                               ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)this
                               );
            local_1f1 = EffectAnalyzer::canReorder(pPVar1,pMVar7,drop[1].value,(Expression *)curr);
            pPVar1 = *(PassOptions **)((long)this + 0xe0);
            pMVar7 = Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::getModule
                               ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)this
                               );
            EffectAnalyzer::EffectAnalyzer(&local_368,pPVar1,pMVar7,(Expression *)curr);
            bVar3 = EffectAnalyzer::hasSideEffects(&local_368);
            EffectAnalyzer::~EffectAnalyzer(&local_368);
            TVar2 = nop.super_SpecificExpression<(wasm::Expression::Id)22>.super_Expression.type;
            local_1f2 = bVar3;
            ppEVar6 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                      operator[](&this_00->
                                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                 ,0);
            *ppEVar6 = (Expression *)TVar2.id;
            if ((((local_1f1 & 1) != 0) && ((local_1f2 & 1) == 0)) &&
               (bVar3 = Properties::canEmitSelectWithArms
                                  ((Expression *)
                                   drop[1].super_SpecificExpression<(wasm::Expression::Id)18>.
                                   super_Expression.type.id,(Expression *)curr), bVar3)) {
              ppEVar6 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                        operator[](&this_00->
                                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                   ,0);
              ExpressionManipulator::nop<wasm::Expression>(*ppEVar6);
              expression = Builder::makeSelect(&local_38,drop[1].value,
                                               (Expression *)
                                               drop[1].
                                               super_SpecificExpression<(wasm::Expression::Id)18>.
                                               super_Expression.type.id,(Expression *)curr);
              Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::replaceCurrent
                        ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)this,
                         (Expression *)expression);
            }
          }
          else {
            pPVar1 = *(PassOptions **)((long)this + 0xe0);
            pMVar7 = Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::getModule
                               ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)this
                               );
            bVar3 = EffectAnalyzer::canReorder
                              (pPVar1,pMVar7,drop[1].value,
                               (Expression *)
                               drop[1].super_SpecificExpression<(wasm::Expression::Id)18>.
                               super_Expression.type.id);
            if (bVar3) {
              ppEVar6 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                        operator[](&this_00->
                                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                   ,0);
              ExpressionManipulator::nop<wasm::Expression>(*ppEVar6);
              pIVar8 = Builder::makeIf(&local_38,drop[1].value,
                                       (Expression *)
                                       drop[1].super_SpecificExpression<(wasm::Expression::Id)18>.
                                       super_Expression.type.id,(Expression *)curr);
              Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::replaceCurrent
                        ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)this,
                         (Expression *)pIVar8);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void restructureIf(Block* curr) {
        auto& list = curr->list;
        // We should be called only on potentially-interesting lists.
        assert(list.size() >= 2);
        if (curr->name.is()) {
          Break* br = nullptr;
          Drop* drop = list[0]->dynCast<Drop>();
          if (drop) {
            br = drop->value->dynCast<Break>();
          } else {
            br = list[0]->dynCast<Break>();
          }
          // Check if the br is conditional and goes to the block. It may or may
          // not have a value, depending on if it was dropped or not. If the
          // type is unreachable that means it is not actually reached, which we
          // can ignore.
          Builder builder(*getModule());
          if (br && br->condition && br->name == curr->name &&
              br->type != Type::unreachable) {
            if (BranchUtils::BranchSeeker::count(curr, curr->name) == 1) {
              // no other breaks to that name, so we can do this
              if (!drop) {
                assert(!br->value);
                replaceCurrent(builder.makeIf(
                  builder.makeUnary(EqZInt32, br->condition), curr));
                ExpressionManipulator::nop(br);
                curr->finalize(curr->type);
              } else {
                // To use an if, the value must have no side effects, as in the
                // if it may not execute.
                if (!EffectAnalyzer(passOptions, *getModule(), br->value)
                       .hasSideEffects()) {
                  // We also need to reorder the condition and the value.
                  if (EffectAnalyzer::canReorder(
                        passOptions, *getModule(), br->condition, br->value)) {
                    ExpressionManipulator::nop(list[0]);
                    replaceCurrent(
                      builder.makeIf(br->condition, br->value, curr));
                  }
                } else {
                  // The value has side effects, so it must always execute. We
                  // may still be able to optimize this, however, by using a
                  // select:
                  //   (block $x
                  //     (drop (br_if $x (value) (cond)))
                  //     ..., no other references to $x
                  //     ..final element..
                  //   )
                  // =>
                  //   (select
                  //     (value)
                  //     (block $x
                  //       ..., no other references to $x
                  //       ..final element..
                  //     )
                  //     (cond)
                  //   )
                  // To do this we must be able to reorder the condition with
                  // the rest of the block (but not the value), and we must be
                  // able to make the rest of the block always execute, so it
                  // must not have side effects.
                  // TODO: we can do this when there *are* other refs to $x,
                  //       with a larger refactoring here.

                  // Test for the conditions with a temporary nop instead of the
                  // br_if.
                  Expression* old = list[0];
                  Nop nop;
                  // After this assignment, curr is what is left in the block
                  // after ignoring the br_if.
                  list[0] = &nop;
                  auto canReorder = EffectAnalyzer::canReorder(
                    passOptions, *getModule(), br->condition, curr);
                  auto hasSideEffects =
                    EffectAnalyzer(passOptions, *getModule(), curr)
                      .hasSideEffects();
                  list[0] = old;
                  if (canReorder && !hasSideEffects &&
                      Properties::canEmitSelectWithArms(br->value, curr)) {
                    ExpressionManipulator::nop(list[0]);
                    replaceCurrent(
                      builder.makeSelect(br->condition, br->value, curr));
                  }
                }
              }
            }
          }
        }
      }